

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O0

size_t tt::detail::convert<long_long>(char *buf,longlong value)

{
  long lVar1;
  char *pcVar2;
  char *pcStack_28;
  int lsd;
  char *p;
  longlong i;
  longlong value_local;
  char *buf_local;
  
  pcVar2 = buf;
  p = (char *)value;
  do {
    pcStack_28 = pcVar2;
    lVar1 = (long)p % 10;
    p = (char *)((long)p / 10);
    pcVar2 = pcStack_28 + 1;
    *pcStack_28 = *(char *)(zero + (int)lVar1);
  } while (p != (char *)0x0);
  if (value != 0) {
    *pcVar2 = '-';
    pcVar2 = pcStack_28 + 2;
  }
  pcStack_28 = pcVar2;
  *pcStack_28 = '\0';
  std::reverse<char*>(buf,pcStack_28);
  return (long)pcStack_28 - (long)buf;
}

Assistant:

size_t convert(char buf[],T value){ //将数值转换为字符串
	T i = value;
	char* p = buf;

	do{
		int lsd = static_cast<int>(i % 10);
		i /= 10;
		*p++ = zero[lsd];
		
	}while(i != 0);

	if(value << 0){
		*p++ = '-';
	}

	*p = '\0';

	std::reverse(buf,p);

	return p - buf;
}